

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_data.c
# Opt level: O2

LY_ERR lyd_print_file(FILE *f,lyd_node *root,LYD_FORMAT format,uint32_t options)

{
  LY_ERR LVar1;
  ly_out *in_RAX;
  ly_out *out;
  
  if (f == (FILE *)0x0) {
    LVar1 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","f","lyd_print_file");
  }
  else {
    out = in_RAX;
    LVar1 = ly_out_new_file(f,&out);
    if (LVar1 == LY_SUCCESS) {
      LVar1 = lyd_print_(out,root,format,options);
      ly_out_free(out,(_func_void_void_ptr *)0x0,'\0');
    }
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_print_file(FILE *f, const struct lyd_node *root, LYD_FORMAT format, uint32_t options)
{
    LY_ERR ret;
    struct ly_out *out;

    LY_CHECK_ARG_RET(NULL, f, LY_EINVAL);

    LY_CHECK_RET(ly_out_new_file(f, &out));
    ret = lyd_print_(out, root, format, options);
    ly_out_free(out, NULL, 0);
    return ret;
}